

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

void __thiscall
absl::lts_20240722::flags_internal::FlagImpl::CheckDefaultValueParsingRoundtrip(FlagImpl *this)

{
  void *pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  MutexLock lock;
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> dst;
  string local_188;
  string v;
  string local_148;
  string error;
  string_view local_108 [3];
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  AlphaNum local_48;
  
  DefaultValue_abi_cxx11_(&v,this);
  lock.mu_ = DataGuard(this);
  absl::lts_20240722::Mutex::Lock();
  MakeInitValue((FlagImpl *)&dst);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  pvVar1 = (*this->op_)(kParse,local_108,
                        dst._M_t.
                        super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>
                        .super__Head_base<0UL,_void_*,_false>._M_head_impl,&error);
  if (pvVar1 != (void *)0x0) {
    std::__cxx11::string::~string((string *)&error);
    std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::~unique_ptr(&dst);
    MutexLock::~MutexLock(&lock);
    std::__cxx11::string::~string((string *)&v);
    return;
  }
  local_108[0] = NullSafeStringView("Flag ");
  local_a8.piece_ = Name(this);
  local_d8.piece_ = NullSafeStringView(" (from ");
  Filename_abi_cxx11_(&local_188,this);
  local_48.piece_._M_len = local_188._M_string_length;
  local_48.piece_._M_str = local_188._M_dataplus._M_p;
  args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x106b9a;
  local_78.piece_ = NullSafeStringView("): string form of default value \'");
  StrCat<std::__cxx11::string,char[30],std::__cxx11::string>
            (&local_148,(lts_20240722 *)local_108,&local_a8,&local_d8,&local_48,&local_78,
             (AlphaNum *)&v,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "\' could not be parsed; error=",(char (*) [30])&error,args_2);
  (*raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/flags/internal/flag.cc"
             ,0x2ad,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_188);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/flags/internal/flag.cc"
                ,0x2ad,
                "virtual void absl::flags_internal::FlagImpl::CheckDefaultValueParsingRoundtrip() const"
               );
}

Assistant:

void FlagImpl::CheckDefaultValueParsingRoundtrip() const {
  std::string v = DefaultValue();

  absl::MutexLock lock(DataGuard());

  auto dst = MakeInitValue();
  std::string error;
  if (!flags_internal::Parse(op_, v, dst.get(), &error)) {
    ABSL_INTERNAL_LOG(
        FATAL,
        absl::StrCat("Flag ", Name(), " (from ", Filename(),
                     "): string form of default value '", v,
                     "' could not be parsed; error=", error));
  }

  // We do not compare dst to def since parsing/unparsing may make
  // small changes, e.g., precision loss for floating point types.
}